

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

string * __thiscall
wabt::anon_unknown_67::BinaryReaderIR::GetUniqueName
          (string *__return_storage_ptr__,BinaryReaderIR *this,BindingHash *bindings,
          string *orig_name)

{
  int __val;
  size_type sVar1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_2d;
  int local_2c;
  string *psStack_28;
  int counter;
  string *orig_name_local;
  BindingHash *bindings_local;
  BinaryReaderIR *this_local;
  string *unique_name;
  
  local_2c = 1;
  local_2d = 0;
  psStack_28 = orig_name;
  orig_name_local = (string *)bindings;
  bindings_local = (BindingHash *)this;
  this_local = (BinaryReaderIR *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)orig_name);
  while (sVar1 = std::
                 unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                 ::count((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                          *)orig_name_local,__return_storage_ptr__), sVar1 != 0) {
    std::operator+(&local_80,psStack_28,".");
    __val = local_2c;
    local_2c = local_2c + 1;
    std::__cxx11::to_string(&local_a0,__val);
    std::operator+(&local_60,&local_80,&local_a0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BinaryReaderIR::GetUniqueName(BindingHash* bindings,
                                          const std::string& orig_name) {
  int counter = 1;
  std::string unique_name = orig_name;
  while (bindings->count(unique_name) != 0) {
    unique_name = orig_name + "." + std::to_string(counter++);
  }
  return unique_name;
}